

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

int __thiscall
Lodtalk::StackInterpreterProxy::returnInteger(StackInterpreterProxy *this,SmallIntegerValue value)

{
  SmallIntegerValue value_local;
  StackInterpreterProxy *this_local;
  
  StackInterpreter::pushIntegerObject(this->interpreter,value);
  StackInterpreter::returnTop(this->interpreter);
  return 0;
}

Assistant:

int StackInterpreterProxy::returnInteger(SmallIntegerValue value)
{
    interpreter->pushIntegerObject(value);
    interpreter->returnTop();
    return 0;
}